

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  _Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  *p_Var1;
  _func_int **pp_Var2;
  pointer pOVar3;
  VersionSet *this_00;
  FilterPolicy *pFVar4;
  void *pvVar5;
  Logger *info_log;
  bool bVar6;
  int iVar7;
  long lVar8;
  Iterator *pIVar9;
  long lVar10;
  long lVar11;
  undefined4 extraout_var;
  uint64_t uVar12;
  undefined4 extraout_var_00;
  _func_int *p_Var13;
  long *plVar14;
  char *pcVar15;
  bool bVar16;
  long lVar17;
  Iterator *in_RDX;
  Env *extraout_RDX;
  Env *extraout_RDX_00;
  long lVar18;
  uint uVar19;
  pointer *ppOVar20;
  TableBuilder *pTVar21;
  ulong uVar22;
  FilterPolicy *pFVar23;
  undefined8 uVar24;
  bool bVar25;
  Status *status;
  ParsedInternalKey ikey;
  string current_user_key;
  LevelSummaryStorage tmp;
  undefined1 local_108 [104];
  char *local_a0;
  Env *local_98;
  undefined8 local_38;
  
  lVar8 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
  pp_Var2 = in_RDX->_vptr_Iterator;
  Log((Logger *)compact[1].smallest_snapshot,"Compacting %d@%d + %d@%d files",
      (ulong)((long)pp_Var2[0x19] - (long)pp_Var2[0x18]) >> 3,(ulong)*(uint *)pp_Var2,
      (ulong)((long)pp_Var2[0x1c] - (long)pp_Var2[0x1b]) >> 3,(ulong)(*(uint *)pp_Var2 + 1));
  iVar7 = VersionSet::NumLevelFiles((VersionSet *)compact[8].outfile,*(int *)in_RDX->_vptr_Iterator)
  ;
  if (iVar7 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x380,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
    __assert_fail("compact->builder == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x381,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  local_108._56_8_ = lVar8;
  if (in_RDX[1]._vptr_Iterator != (_func_int **)0x0) {
    __assert_fail("compact->outfile == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x382,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  pOVar3 = compact[7].outputs.
           super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (VersionSet *)compact[8].outfile;
  ppOVar20 = (pointer *)&(pOVar3->smallest).rep_._M_string_length;
  if (pOVar3 == (pointer)(compact + 7)) {
    ppOVar20 = (pointer *)&this_00->last_sequence_;
  }
  (in_RDX->cleanup_head_).function = (CleanupFunction)*ppOVar20;
  pIVar9 = VersionSet::MakeInputIterator(this_00,(Compaction *)in_RDX->_vptr_Iterator);
  local_108._16_8_ = &compact[3].smallest_snapshot;
  pthread_mutex_unlock((pthread_mutex_t *)local_108._16_8_);
  (*pIVar9->_vptr_Iterator[3])(pIVar9);
  lVar8 = 0;
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_108._24_8_ = "";
  local_108._32_8_ = (_func_int **)0x0;
  local_108._72_8_ = local_108 + 0x58;
  local_108._80_8_ = (Env *)0x0;
  local_108[0x58] = 0;
  iVar7 = (*pIVar9->_vptr_Iterator[2])(pIVar9);
  if ((char)iVar7 == '\0') {
LAB_00115e61:
    if (((ulong)compact[3].builder & 1) == 0) {
      uVar24 = (this->super_DB)._vptr_DB;
    }
    else {
      local_a0 = "Deleting DB during compaction";
      local_98 = (Env *)0x1d;
      local_108._0_8_ = "";
      local_108._8_8_ = (Env *)0x0;
      Status::Status((Status *)&stack0xffffffffffffffc8,kIOError,(Slice *)&stack0xffffffffffffff60,
                     (Slice *)local_108);
      uVar24 = local_38;
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_38;
      local_38 = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
    }
    if ((_func_int **)uVar24 != (_func_int **)0x0) goto LAB_00115ed8;
    if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
      FinishCompactionOutputFile((DBImpl *)&stack0xffffffffffffff60,compact,in_RDX);
      (this->super_DB)._vptr_DB = (_func_int **)local_a0;
      if ((Comparator *)local_a0 != (Comparator *)0x0) goto LAB_00115ed8;
    }
    (*pIVar9->_vptr_Iterator[10])(&stack0xffffffffffffff60,pIVar9);
    (this->super_DB)._vptr_DB = (_func_int **)local_a0;
    bVar25 = (Comparator *)local_a0 == (Comparator *)0x0;
  }
  else {
    pFVar23 = (FilterPolicy *)0xffffffffffffff;
    local_108._64_8_ = &compact[3].total_bytes;
    lVar8 = 0;
    bVar25 = false;
    do {
      if (((ulong)compact[3].builder & 1) != 0) break;
      if (((ulong)compact[5].compaction & 1) != 0) {
        lVar10 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
        iVar7 = pthread_mutex_lock((pthread_mutex_t *)local_108._16_8_);
        if (iVar7 != 0) goto LAB_001160ad;
        if (compact[4].total_bytes != 0) {
          CompactMemTable((DBImpl *)compact);
          std::condition_variable::notify_all();
        }
        pthread_mutex_unlock((pthread_mutex_t *)local_108._16_8_);
        lVar11 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
        lVar8 = (lVar8 - lVar10) + lVar11;
      }
      iVar7 = (*pIVar9->_vptr_Iterator[8])(pIVar9);
      local_a0 = (char *)CONCAT44(extraout_var,iVar7);
      local_98 = extraout_RDX;
      bVar6 = Compaction::ShouldStopBefore
                        ((Compaction *)in_RDX->_vptr_Iterator,(Slice *)&stack0xffffffffffffff60);
      if ((bVar6) && (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0)) {
        FinishCompactionOutputFile((DBImpl *)local_108,compact,in_RDX);
        uVar24 = local_108._0_8_;
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_108._0_8_;
        local_108._0_8_ = pp_Var2;
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
        if ((_func_int **)uVar24 != (_func_int **)0x0) goto LAB_00115ed8;
      }
      if (local_98 < (Env *)0x8) {
LAB_00115cd6:
        local_108._80_8_ = (Env *)0x0;
        *(char *)(_func_int ***)local_108._72_8_ = '\0';
        bVar25 = false;
        pFVar23 = (FilterPolicy *)0xffffffffffffff;
LAB_00115cf9:
        pTVar21 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
        if (pTVar21 == (TableBuilder *)0x0) {
          OpenCompactionOutputFile((DBImpl *)local_108,compact);
          uVar24 = local_108._0_8_;
          pp_Var2 = (this->super_DB)._vptr_DB;
          (this->super_DB)._vptr_DB = (_func_int **)local_108._0_8_;
          local_108._0_8_ = pp_Var2;
          if (pp_Var2 != (_func_int **)0x0) {
            operator_delete__(pp_Var2);
          }
          if ((_func_int **)uVar24 != (_func_int **)0x0) goto LAB_00115ed8;
          pTVar21 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
        }
        uVar12 = TableBuilder::NumEntries(pTVar21);
        if (uVar12 == 0) {
          pvVar5 = (in_RDX->cleanup_head_).arg2;
          std::__cxx11::string::_M_replace
                    ((long)pvVar5 - 0x40,0,*(char **)((long)pvVar5 + -0x38),(ulong)local_a0);
        }
        pvVar5 = (in_RDX->cleanup_head_).arg2;
        std::__cxx11::string::_M_replace
                  ((long)pvVar5 - 0x20,0,*(char **)((long)pvVar5 + -0x18),(ulong)local_a0);
        pTVar21 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
        iVar7 = (*pIVar9->_vptr_Iterator[9])(pIVar9);
        local_108._0_8_ = CONCAT44(extraout_var_00,iVar7);
        local_108._8_8_ = extraout_RDX_00;
        TableBuilder::Add(pTVar21,(Slice *)&stack0xffffffffffffff60,(Slice *)local_108);
        p_Var13 = (_func_int *)
                  TableBuilder::FileSize((TableBuilder *)in_RDX[1].cleanup_head_.function);
        if (in_RDX->_vptr_Iterator[1] <= p_Var13) {
          FinishCompactionOutputFile((DBImpl *)local_108,compact,in_RDX);
          uVar24 = local_108._0_8_;
          pp_Var2 = (this->super_DB)._vptr_DB;
          (this->super_DB)._vptr_DB = (_func_int **)local_108._0_8_;
          local_108._0_8_ = pp_Var2;
          if (pp_Var2 != (_func_int **)0x0) {
            operator_delete__(pp_Var2);
          }
          if ((_func_int **)uVar24 != (_func_int **)0x0) goto LAB_00115ed8;
        }
      }
      else {
        uVar22 = *(ulong *)((long)&((Comparator *)((long)local_a0 + -8))->_vptr_Comparator +
                           (long)local_98);
        local_108._48_4_ = (uint)uVar22 & 0xff;
        local_108._40_8_ = uVar22 >> 8;
        local_108._32_8_ = local_98 + -1;
        local_108._24_8_ = local_a0;
        if (1 < (uint)local_108._48_4_) goto LAB_00115cd6;
        if (bVar25) {
          pOVar3 = (compact->outputs).
                   super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_108._0_8_ = local_108._72_8_;
          local_108._8_8_ = local_108._80_8_;
          iVar7 = (**(code **)(pOVar3->number + 0x10))(pOVar3,local_108 + 0x18,(DBImpl *)local_108);
          if (iVar7 != 0) goto LAB_00115c8b;
        }
        else {
LAB_00115c8b:
          std::__cxx11::string::_M_replace
                    ((ulong)(local_108 + 0x48),0,(char *)local_108._80_8_,local_108._24_8_);
          pFVar23 = (FilterPolicy *)0xffffffffffffff;
        }
        pFVar4 = (FilterPolicy *)(in_RDX->cleanup_head_).function;
        if (pFVar4 < pFVar23) {
          if (pFVar4 < (ulong)local_108._40_8_ || local_108._48_4_ != 0) {
            bVar25 = true;
            pFVar23 = (FilterPolicy *)local_108._40_8_;
          }
          else {
            bVar6 = Compaction::IsBaseLevelForKey
                              ((Compaction *)in_RDX->_vptr_Iterator,(Slice *)(local_108 + 0x18));
            bVar25 = true;
            pFVar23 = (FilterPolicy *)local_108._40_8_;
            if (bVar6) goto LAB_00115e0f;
          }
          goto LAB_00115cf9;
        }
        bVar25 = true;
        pFVar23 = (FilterPolicy *)local_108._40_8_;
      }
LAB_00115e0f:
      (*pIVar9->_vptr_Iterator[6])(pIVar9);
      iVar7 = (*pIVar9->_vptr_Iterator[2])(pIVar9);
    } while ((char)iVar7 != '\0');
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) goto LAB_00115e61;
LAB_00115ed8:
    bVar25 = false;
  }
  (*pIVar9->_vptr_Iterator[1])(pIVar9);
  lVar10 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
  lVar8 = lVar8 + local_108._56_8_;
  lVar11 = 0;
  lVar18 = 0;
  bVar6 = true;
  do {
    bVar16 = bVar6;
    p_Var13 = in_RDX->_vptr_Iterator[lVar11 * 3 + 0x18];
    uVar19 = (uint)((ulong)((long)in_RDX->_vptr_Iterator[lVar11 * 3 + 0x19] - (long)p_Var13) >> 3);
    if (0 < (int)uVar19) {
      uVar22 = 0;
      do {
        lVar18 = lVar18 + *(long *)(*(long *)(p_Var13 + uVar22 * 8) + 0x10);
        uVar22 = uVar22 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar22);
    }
    lVar11 = 1;
    bVar6 = false;
  } while (bVar16);
  pvVar5 = (in_RDX->cleanup_head_).arg1;
  lVar11 = (long)(in_RDX->cleanup_head_).arg2 - (long)pvVar5;
  if (lVar11 == 0) {
    lVar11 = 0;
  }
  else {
    lVar17 = (lVar11 >> 4) * -0x3333333333333333;
    lVar17 = lVar17 + (ulong)(lVar17 == 0);
    plVar14 = (long *)((long)pvVar5 + 8);
    lVar11 = 0;
    do {
      lVar11 = lVar11 + *plVar14;
      plVar14 = plVar14 + 10;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)local_108._16_8_);
  if (iVar7 != 0) {
LAB_001160ad:
    std::__throw_system_error(iVar7);
  }
  iVar7 = *(int *)in_RDX->_vptr_Iterator;
  p_Var1 = &(&compact[9].outputs)[iVar7].
            super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  ;
  (p_Var1->_M_impl).super__Vector_impl_data._M_start =
       (pointer)((long)(p_Var1->_M_impl).super__Vector_impl_data._M_start + (lVar10 - lVar8));
  ppOVar20 = &(&compact[9].outputs)[iVar7].
              super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *ppOVar20 = (pointer)((long)&(*ppOVar20)->number + lVar18);
  ppOVar20 = &(&compact[9].outputs)[iVar7].
              super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *ppOVar20 = (pointer)((long)&(*ppOVar20)->number + lVar11);
  if (bVar25) {
    InstallCompactionResults((DBImpl *)&stack0xffffffffffffff60,compact);
    (this->super_DB)._vptr_DB = (_func_int **)local_a0;
    if ((Comparator *)local_a0 == (Comparator *)0x0) goto LAB_00115ffa;
  }
  RecordBackgroundError((DBImpl *)compact,(Status *)this);
LAB_00115ffa:
  info_log = (Logger *)compact[1].smallest_snapshot;
  pcVar15 = VersionSet::LevelSummary
                      ((VersionSet *)compact[8].outfile,
                       (LevelSummaryStorage *)&stack0xffffffffffffff60);
  Log(info_log,"compacted to: %s",pcVar15);
  if ((Logger *)local_108._72_8_ != (Logger *)(local_108 + 0x58)) {
    operator_delete((void *)local_108._72_8_);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState* compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder == nullptr);
  assert(compact->outfile == nullptr);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->sequence_number();
  }

  Iterator* input = versions_->MakeInputIterator(compact->compaction);

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  while (input->Valid() && !shutting_down_.load(std::memory_order_acquire)) {
    // Prioritize immutable compaction work
    if (has_imm_.load(std::memory_order_relaxed)) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_ != nullptr) {
        CompactMemTable();
        // Wake up MakeRoomForWrite() if necessary.
        background_work_finished_signal_.SignalAll();
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder != nullptr) {
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key, Slice(current_user_key)) !=
              0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;  // (A)
      } else if (ikey.type == kTypeDeletion &&
                 ikey.sequence <= compact->smallest_snapshot &&
                 compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder == nullptr) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries() == 0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.load(std::memory_order_acquire)) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder != nullptr) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = nullptr;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log, "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}